

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentRecord.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::EnvironmentRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EnvironmentRecord *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Environment Record\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\tRecord Type: ",0xe);
  ENUMS::GetEnumAsStringEnvironmentRecordType_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui32EnvRecTyp,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tLength:      ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tIndex:       ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString EnvironmentRecord::GetAsString() const
{
    KStringStream ss;

    ss << "Environment Record\n"
       << "\tRecord Type: " << GetEnumAsStringEnvironmentRecordType( m_ui32EnvRecTyp ) << "\n"
       << "\tLength:      " << m_ui16Length                                            << "\n"
       << "\tIndex:       " << ( KUINT16 )m_ui8Index                                   << "\n";

    return ss.str();
}